

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.hh
# Opt level: O0

void __thiscall
tchecker::ta::
edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
::edges_valuations_iterator_t
          (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
           *this,range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>
                 *edges_range,
          range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>
          *valuations_range)

{
  final_iterator_t *pfVar1;
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  *it;
  range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>
  *valuations_range_local;
  range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t> *edges_range_local;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  *this_local;
  
  range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>::range_t
            (&this->_edges_range,edges_range);
  pfVar1 = range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>::begin
                     (&this->_edges_range);
  syncprod::final_iterator_t::final_iterator_t(&this->_edges_it,pfVar1);
  range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>
  ::range_t(&this->_valuations_range,valuations_range);
  it = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>
       ::begin(&this->_valuations_range);
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::cartesian_iterator_t(&this->_valuations_it,it);
  return;
}

Assistant:

edges_valuations_iterator_t(EDGES_RANGE const & edges_range, VALUATIONS_RANGE const & valuations_range)
      : _edges_range(edges_range), _edges_it(_edges_range.begin()), _valuations_range(valuations_range),
        _valuations_it(_valuations_range.begin())
  {
  }